

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QByteArrayView * QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)

{
  QLatin1StringView latin1;
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  const_pointer pvVar4;
  ulong uVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  void *pvVar6;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QDateTime *dt;
  QString sansWeekday;
  QLocale c;
  int second;
  int minute;
  int hour;
  int year;
  int day;
  char month_name [4];
  QDateTime *in_stack_fffffffffffffed8;
  QDateTime *other;
  Initialization spec;
  QDateTime *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QByteArrayView *this;
  uint in_stack_ffffffffffffff10;
  QByteArrayView *pQVar7;
  QTimeZone local_e0 [4];
  QDateTime local_c0 [8];
  const_pointer local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  QTime local_7c;
  QDate local_78;
  QDateTime local_70 [12];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_40 [24];
  QDateTime local_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar6 = (void *)0x2c;
  this = in_RDI;
  pQVar7 = in_RDI;
  local_20 = in_RSI;
  local_18 = in_RDX;
  qVar3 = QByteArrayView::indexOf
                    ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                     ,(char)((ulong)in_stack_fffffffffffffee0 >> 0x38),
                     (qsizetype)in_stack_fffffffffffffed8);
  iVar1 = (int)qVar3;
  in_stack_ffffffffffffff10 = in_stack_ffffffffffffff10 & 0xffffff;
  this->m_size = -0x5555555555555556;
  QDateTime::QDateTime((QDateTime *)this);
  if (iVar1 == -1) {
    local_50 = local_20;
    local_48 = local_18;
    QString::fromLatin1((QByteArrayView *)local_40);
    QDateTime::fromString((QString *)this,(DateFormat)((ulong)in_RDI >> 0x20));
    QDateTime::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    spec = (Initialization)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    QDateTime::~QDateTime(local_28);
    QString::~QString((QString *)0x1f4e1c);
  }
  else if (iVar1 == 3) {
    local_c[0] = -0x56;
    local_c[1] = -0x56;
    local_c[2] = -0x56;
    local_c[3] = -0x56;
    local_54 = -0x55555556;
    local_58 = -0x55555556;
    local_5c = -0x55555556;
    local_60 = -0x55555556;
    local_64 = -0x55555556;
    pvVar4 = QByteArrayView::constData((QByteArrayView *)0x1f4e7d);
    other = (QDateTime *)&local_60;
    in_stack_fffffffffffffee0 = (QDateTime *)&local_64;
    iVar1 = __isoc99_sscanf(pvVar4,"%*3s, %d %3s %d %d:%d:%d \'GMT\'",&local_54,local_c,&local_58,
                            &local_5c);
    if (iVar1 == 6) {
      iVar1 = local_58;
      iVar2 = name_to_month(local_c);
      QDate::QDate(&local_78,iVar1,iVar2,local_54);
      QTime::QTime(&local_7c,local_5c,local_60,local_64,0);
      QDateTime::QDateTime(local_70,local_78.jd,local_7c.mds,1);
      QDateTime::operator=(in_stack_fffffffffffffee0,other);
      QDateTime::~QDateTime(local_70);
    }
    spec = (Initialization)((ulong)other >> 0x20);
  }
  else {
    local_88 = 0xaaaaaaaaaaaaaaaa;
    QLocale::c(&local_88,pvVar6);
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_b8 = QByteArrayView::constData((QByteArrayView *)0x1f4fc2);
    local_b8 = local_b8 + (long)iVar1 + 2;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_RDI,(char **)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QString::fromLatin1((QByteArrayView *)&local_a0);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (size_t)in_stack_fffffffffffffee0);
    latin1.m_size._4_4_ = iVar1;
    latin1.m_size._0_4_ = in_stack_ffffffffffffff10;
    latin1.m_data = (char *)pQVar7;
    QString::QString((QString *)in_RDI,latin1);
    QLocale::toDateTime((QString *)local_c0,(QString *)&local_88,(int)&local_a0);
    QDateTime::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    spec = (Initialization)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    QDateTime::~QDateTime(local_c0);
    QString::~QString((QString *)0x1f5073);
    QString::~QString((QString *)0x1f5080);
    QLocale::~QLocale((QLocale *)&local_88);
  }
  uVar5 = QDateTime::isValid();
  if ((uVar5 & 1) != 0) {
    QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffee0,spec);
    QDateTime::setTimeZone(this,local_e0,1);
    QTimeZone::~QTimeZone(local_e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)
{
    // HTTP dates have three possible formats:
    //  RFC 1123/822      -   ddd, dd MMM yyyy hh:mm:ss "GMT"
    //  RFC 850           -   dddd, dd-MMM-yy hh:mm:ss "GMT"
    //  ANSI C's asctime  -   ddd MMM d hh:mm:ss yyyy
    // We only handle them exactly. If they deviate, we bail out.

    int pos = value.indexOf(',');
    QDateTime dt;
#if QT_CONFIG(datestring)
    if (pos == -1) {
        // no comma -> asctime(3) format
        dt = QDateTime::fromString(QString::fromLatin1(value), Qt::TextDate);
    } else {
        // Use sscanf over QLocal/QDateTimeParser for speed reasons. See the
        // Qt WebKit performance benchmarks to get an idea.
        if (pos == 3) {
            char month_name[4];
            int day, year, hour, minute, second;
#ifdef Q_CC_MSVC
            // Use secure version to avoid compiler warning
            if (sscanf_s(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, 4, &year, &hour, &minute, &second) == 6)
#else
            // The POSIX secure mode is %ms (which allocates memory), too bleeding edge for now
            // In any case this is already safe as field width is specified.
            if (sscanf(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, &year, &hour, &minute, &second) == 6)
#endif
                dt = QDateTime(QDate(year, name_to_month(month_name), day), QTime(hour, minute, second));
        } else {
            QLocale c = QLocale::c();
            // eat the weekday, the comma and the space following it
            QString sansWeekday = QString::fromLatin1(value.constData() + pos + 2);
            // must be RFC 850 date
            dt = c.toDateTime(sansWeekday, "dd-MMM-yy hh:mm:ss 'GMT'"_L1);
        }
    }
#endif // datestring

    if (dt.isValid())
        dt.setTimeZone(QTimeZone::UTC);
    return dt;
}